

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

bool __thiscall r_comp::Preprocessor::isTemplateClass(Preprocessor *this,Ptr *replistruct)

{
  Type TVar1;
  element_type *peVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  pointer psVar8;
  string type;
  string name;
  Ptr local_88;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  Preprocessor *local_38;
  
  peVar2 = (replistruct->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  psVar8 = (peVar2->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (peVar2->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  peVar2 = local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  do {
    bVar4 = psVar8 != psVar3;
    if (!bVar4) {
      return bVar4;
    }
    local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar8->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar8->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_58 = local_48;
    local_50 = 0;
    local_48[0] = 0;
    local_78 = local_68;
    local_70 = 0;
    local_68[0] = 0;
    TVar1 = (local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            type;
    if ((TVar1 - Structure < 2) || (TVar1 == Development)) {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = this_00;
      bVar5 = isTemplateClass(local_38,&local_88);
      if (local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      peVar2 = local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar5) goto LAB_00138acb;
    }
    else if ((TVar1 == Atom) &&
            (psVar7 = &(local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->cmd,
            local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar2, iVar6 = std::__cxx11::string::compare((char *)psVar7),
            peVar2 = local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, iVar6 == 0)) {
LAB_00138acb:
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return bVar4;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return bVar4;
    }
    local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    psVar8 = psVar8 + 1;
    peVar2 = local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while( true );
}

Assistant:

bool Preprocessor::isTemplateClass(RepliStruct::Ptr replistruct)
{
    for (RepliStruct::Ptr childstruct : replistruct->args) {
        std::string name;
        std::string type;

        switch (childstruct->type) {
        case RepliStruct::Atom:
            if (childstruct->cmd == ":~") {
                return true;
            }

            break;

        case RepliStruct::Structure: // template instantiation; args are the actual parameters.
        case RepliStruct::Development: // actual template arg as a list of args.
        case RepliStruct::Set: // sets can contain tpl args.
            if (isTemplateClass(childstruct)) {
                return true;
            }

            break;

        default:
            break;
        }
    }

    return false;
}